

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::GenerateGetImmutableOrScriptUnreferencedString
          (Lowerer *this,RegOpnd *strOpnd,Instr *insertBeforeInstr,JnHelperMethod helperMethod,
          bool loweringCloneStr,bool reloadDst)

{
  Func *func_00;
  bool bVar1;
  LabelInstr *target;
  LabelInstr *labelTarget;
  AddrOpnd *compareSrc2;
  IndirOpnd *compareSrc1;
  Opnd *compareSrc2_00;
  Instr *this_00;
  HelperCallOpnd *newSrc;
  Lowerer *local_80;
  Instr *callInstr;
  LabelInstr *doneLabel;
  LabelInstr *helperLabel;
  RegOpnd *dstOpnd;
  Func *func;
  bool reloadDst_local;
  bool loweringCloneStr_local;
  JnHelperMethod helperMethod_local;
  Instr *insertBeforeInstr_local;
  RegOpnd *strOpnd_local;
  Lowerer *this_local;
  
  this_local = (Lowerer *)strOpnd;
  if ((*(uint *)&strOpnd->m_sym->field_0x18 >> 10 & 1) == 0) {
    func_00 = this->m_func;
    local_80 = (Lowerer *)strOpnd;
    if (reloadDst) {
      local_80 = (Lowerer *)IR::RegOpnd::New(TyVar,func_00);
    }
    target = IR::LabelInstr::New(Label,func_00,true);
    labelTarget = IR::LabelInstr::New(Label,func_00,false);
    bVar1 = IR::Opnd::IsNotTaggedValue(&strOpnd->super_Opnd);
    if (!bVar1) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&strOpnd->super_Opnd,insertBeforeInstr,labelTarget,false);
    }
    if ((loweringCloneStr) && (bVar1 = Func::IsLoopBody(func_00), bVar1)) {
      compareSrc2 = IR::AddrOpnd::New((Var)0x0,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
      InsertCompareBranch(this,&strOpnd->super_Opnd,&compareSrc2->super_Opnd,BrEq_A,false,
                          labelTarget,insertBeforeInstr,false);
    }
    compareSrc1 = IR::IndirOpnd::New(strOpnd,0,TyUint64,func_00,false);
    compareSrc2_00 = LoadVTableValueOpnd(this,insertBeforeInstr,VtableCompoundString);
    InsertCompareBranch(this,&compareSrc1->super_Opnd,compareSrc2_00,BrEq_A,target,insertBeforeInstr
                        ,false);
    if (reloadDst) {
      InsertMove((Opnd *)local_80,&strOpnd->super_Opnd,insertBeforeInstr,true);
    }
    InsertBranch(Br,labelTarget,insertBeforeInstr);
    IR::Instr::InsertBefore(insertBeforeInstr,&target->super_Instr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,insertBeforeInstr,&strOpnd->super_Opnd);
    this_00 = IR::Instr::New(Call,(Opnd *)local_80,func_00);
    newSrc = IR::HelperCallOpnd::New(helperMethod,func_00);
    IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(insertBeforeInstr,this_00);
    LowererMD::LowerCall(&this->m_lowererMD,this_00,0);
    IR::Instr::InsertBefore(insertBeforeInstr,&labelTarget->super_Instr);
    this_local = local_80;
  }
  return (RegOpnd *)this_local;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateGetImmutableOrScriptUnreferencedString(IR::RegOpnd * strOpnd, IR::Instr * insertBeforeInstr, IR::JnHelperMethod helperMethod, bool loweringCloneStr, bool reloadDst)
{
    if (strOpnd->m_sym->m_isStrConst)
    {
        return strOpnd;
    }

    Func * const func = this->m_func;
    IR::RegOpnd  *dstOpnd = reloadDst == true ? IR::RegOpnd::New(TyVar, func) : strOpnd;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);

    if (!strOpnd->IsNotTaggedValue())
    {
        this->m_lowererMD.GenerateObjectTest(strOpnd, insertBeforeInstr, doneLabel);
    }

    if (loweringCloneStr && func->IsLoopBody())
    {
        // Check if strOpnd is NULL before the CloneStr. There could be cases where SimpleJit might have dead stored instructions corresponding to the definition/use of strOpnd.
        // As a result during a bailout when we restore values from interpreter stack frame we may end up having strOpnd as nullptr. During FullJit we may not dead store the
        // instructions defining/using strOpnd due to StSlot instructions added at the end of jitted loop body. As a result, when we bailout (BailOnSimpleJitToFullJitLoopBody)
        // strOpnd could have a NULL value causing CloneStr to dereference a nullptr.
        this->InsertCompareBranch(strOpnd, IR::AddrOpnd::New(nullptr, IR::AddrOpndKindDynamicMisc, this->m_func), Js::OpCode::BrEq_A, false /*isUnsigned*/, doneLabel, insertBeforeInstr);
    }

    // CMP [strOpnd], Js::CompoundString::`vtable'
    // JEQ $helper
    InsertCompareBranch(
        IR::IndirOpnd::New(strOpnd, 0, TyMachPtr, func),
        this->LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableCompoundString),
        Js::OpCode::BrEq_A,
        helperLabel,
        insertBeforeInstr);

    if (reloadDst)
    {
        InsertMove(dstOpnd, strOpnd, insertBeforeInstr);
    }

    InsertBranch(Js::OpCode::Br, doneLabel, insertBeforeInstr);
    insertBeforeInstr->InsertBefore(helperLabel);

    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, strOpnd);
    IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, dstOpnd, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));
    insertBeforeInstr->InsertBefore(callInstr);
    this->m_lowererMD.LowerCall(callInstr, 0);

    insertBeforeInstr->InsertBefore(doneLabel);

    return dstOpnd;
}